

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-calcs.c
# Opt level: O2

void notice_stuff(player *p)

{
  player_upkeep *ppVar1;
  uint uVar2;
  
  ppVar1 = p->upkeep;
  uVar2 = ppVar1->notice;
  if (uVar2 != 0) {
    if ((uVar2 & 2) != 0) {
      ppVar1->notice = uVar2 & 0xfffffffd;
      ignore_drop(p);
      ppVar1 = p->upkeep;
      uVar2 = ppVar1->notice;
    }
    if ((uVar2 & 1) != 0) {
      ppVar1->notice = uVar2 & 0xfffffffe;
      combine_pack(p);
      ppVar1 = p->upkeep;
      uVar2 = ppVar1->notice;
    }
    if ((uVar2 & 4) != 0) {
      ppVar1->notice = uVar2 & 0xfffffffb;
      show_monster_messages();
      return;
    }
  }
  return;
}

Assistant:

void notice_stuff(struct player *p)
{
	/* Notice stuff */
	if (!p->upkeep->notice) return;

	/* Deal with ignore stuff */
	if (p->upkeep->notice & PN_IGNORE) {
		p->upkeep->notice &= ~(PN_IGNORE);
		ignore_drop(p);
	}

	/* Combine the pack */
	if (p->upkeep->notice & PN_COMBINE) {
		p->upkeep->notice &= ~(PN_COMBINE);
		combine_pack(p);
	}

	/* Dump the monster messages */
	if (p->upkeep->notice & PN_MON_MESSAGE) {
		p->upkeep->notice &= ~(PN_MON_MESSAGE);

		/* Make sure this comes after all of the monster messages */
		show_monster_messages();
	}
}